

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cpp
# Opt level: O2

BTLeafNode * __thiscall storage::BTLeafNode::split(BTLeafNode *this,int key,Record *record)

{
  int *arr;
  bool bVar1;
  int cnt;
  BTLeafNode *pBVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  uint cnt_00;
  Record *pRVar7;
  int iVar8;
  Record **ppRVar9;
  uint uVar10;
  int *arr_00;
  
  pBVar2 = (BTLeafNode *)operator_new(0x278);
  (pBVar2->super_BTNode).child_index_ = -1;
  (pBVar2->super_BTNode)._vptr_BTNode = (_func_int **)&PTR_is_leaf_node_0010ad90;
  bVar1 = false;
  memset(pBVar2->record_links_,0,400);
  pBVar2->next_ = this->next_;
  this->next_ = pBVar2;
  iVar4 = (this->super_BTNode).used_links_count_;
  uVar3 = iVar4 - 1;
  cnt = (int)((long)iVar4 / 2);
  cnt_00 = iVar4 - cnt;
  uVar6 = (ulong)cnt_00;
  arr = (this->super_BTNode).keys_;
  arr_00 = (pBVar2->super_BTNode).keys_;
  uVar5 = (long)iVar4 / 2 & 0xffffffff;
  while (iVar4 = (int)uVar5, 0 < (int)uVar3) {
    uVar10 = uVar3 - 1;
    iVar8 = arr[uVar10];
    pRVar7 = this->record_links_[uVar10];
    if (iVar8 < key) {
      if (bVar1) {
        bVar1 = true;
      }
      else {
        bVar1 = true;
        pRVar7 = record;
        iVar8 = key;
        uVar10 = uVar3;
      }
    }
    uVar3 = uVar10;
    if ((int)uVar6 < 1) {
      uVar5 = (ulong)(iVar4 - 1);
      (this->super_BTNode).keys_[(long)iVar4 + -1] = iVar8;
      ppRVar9 = this->record_links_ + (long)iVar4 + -1;
    }
    else {
      uVar6 = (ulong)((int)uVar6 - 1);
      arr_00[uVar6] = iVar8;
      ppRVar9 = pBVar2->record_links_ + uVar6;
    }
    *ppRVar9 = pRVar7;
  }
  if (0 < iVar4) {
    arr[iVar4 - 1U] = key;
    this->record_links_[iVar4 - 1U] = record;
  }
  (pBVar2->super_BTNode).parent_ = (this->super_BTNode).parent_;
  (this->super_BTNode).used_links_count_ = cnt + 1;
  (pBVar2->super_BTNode).used_links_count_ = cnt_00 + 1;
  bVar1 = cc(arr,cnt);
  if (!bVar1) {
    __assert_fail("cc(this->keys_, this->key_count())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Raphael2017[P]BTree/btree.cpp"
                  ,0x1c7,"BTLeafNode *storage::BTLeafNode::split(int, Record *)");
  }
  bVar1 = cc(arr_00,cnt_00);
  if (!bVar1) {
    __assert_fail("cc(M->keys_, M->key_count())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Raphael2017[P]BTree/btree.cpp"
                  ,0x1c8,"BTLeafNode *storage::BTLeafNode::split(int, Record *)");
  }
  return pBVar2;
}

Assistant:

BTLeafNode *BTLeafNode::split(int key, Record *record) {
        BTLeafNode *M = new BTLeafNode;
        M->next_ = this->next_;
        this->next_ = M;
        int SN = (key_count() + 1) / 2;
        int SM = (key_count() + 1) - SN;

        int SN1 = SN, SM1 = SM;

        bool flag = false;  // first
        for (int i = key_count() - 1; i >= 0; --i) {
            int k = keys_[i];
            Record *r = record_links_[i];
            if (keys_[i] < key && !flag) {
                i++;
                k = key;
                r = record;
                flag = true;
            }
            if (SM > 0) {
                M->keys_[SM - 1] = k;
                M->record_links_[SM - 1] = r;
                SM--;
            } else {
                keys_[SN - 1] = k;
                record_links_[SN - 1] = r;
                SN--;
            }
        }
        if (SN > 0) {
            keys_[SN - 1] = key;
            record_links_[SN - 1] = record;
        }
        M->parent_ = parent_;
        this->used_links_count_ = 1 + SN1;
        M->used_links_count_ = 1 + SM1;

        assert(cc(this->keys_, this->key_count()));
        assert(cc(M->keys_, M->key_count()));

        return M;
    }